

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4fa30e::cURLProgressHelper::cURLProgressHelper
          (cURLProgressHelper *this,cmFileCommand *fc,char *text)

{
  (this->Text)._M_dataplus._M_p = (pointer)&(this->Text).field_2;
  (this->Text)._M_string_length = 0;
  (this->Text).field_2._M_local_buf[0] = '\0';
  this->CurrentPercentage = -1;
  this->FileCommand = fc;
  strlen(text);
  std::__cxx11::string::_M_replace((ulong)&this->Text,0,(char *)0x0,(ulong)text);
  return;
}

Assistant:

cURLProgressHelper(cmFileCommand* fc, const char* text)
  {
    this->CurrentPercentage = -1;
    this->FileCommand = fc;
    this->Text = text;
  }